

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline::getPipelinedCap
          (RpcPipeline *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  size_t size;
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook,_std::nullptr_t> OVar1;
  Array<capnp::PipelineOp> local_90;
  PipelineOp *local_68;
  PipelineOp *op;
  PipelineOp *__end3;
  PipelineOp *__begin3;
  ArrayPtr<const_capnp::PipelineOp> *__range3;
  ArrayBuilder<capnp::PipelineOp> copy;
  RpcPipeline *this_local;
  ArrayPtr<const_capnp::PipelineOp> ops_local;
  
  this_local = (RpcPipeline *)ops.size_;
  copy.disposer = (ArrayDisposer *)ops.ptr;
  ops_local.size_ = (size_t)this;
  size = kj::ArrayPtr<const_capnp::PipelineOp>::size
                   ((ArrayPtr<const_capnp::PipelineOp> *)&this_local);
  kj::heapArrayBuilder<capnp::PipelineOp>((ArrayBuilder<capnp::PipelineOp> *)&__range3,size);
  __begin3 = (PipelineOp *)&this_local;
  __end3 = kj::ArrayPtr<const_capnp::PipelineOp>::begin
                     ((ArrayPtr<const_capnp::PipelineOp> *)__begin3);
  op = kj::ArrayPtr<const_capnp::PipelineOp>::end((ArrayPtr<const_capnp::PipelineOp> *)__begin3);
  for (; __end3 != op; __end3 = __end3 + 1) {
    local_68 = __end3;
    kj::ArrayBuilder<capnp::PipelineOp>::add<capnp::PipelineOp_const&>
              ((ArrayBuilder<capnp::PipelineOp> *)&__range3,__end3);
  }
  kj::ArrayBuilder<capnp::PipelineOp>::finish
            (&local_90,(ArrayBuilder<capnp::PipelineOp> *)&__range3);
  getPipelinedCap(this,(Array<capnp::PipelineOp> *)ops.ptr);
  kj::Array<capnp::PipelineOp>::~Array(&local_90);
  kj::ArrayBuilder<capnp::PipelineOp>::~ArrayBuilder((ArrayBuilder<capnp::PipelineOp> *)&__range3);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
      auto copy = kj::heapArrayBuilder<PipelineOp>(ops.size());
      for (auto& op: ops) {
        copy.add(op);
      }
      return getPipelinedCap(copy.finish());
    }